

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString::Builder<256u>>
               (JavascriptString *s,CharCount appendCharLength,Builder<256U> *toString)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  CharCount CVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  Type *pTVar7;
  uint uVar8;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36b,"(s)","s");
    if (!bVar2) goto LAB_00d2e9b9;
    *puVar5 = 0;
  }
  if (s->m_charLength != appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36c,"(appendCharLength == s->GetLength())",
                                "appendCharLength == s->GetLength()");
    if (!bVar2) goto LAB_00d2e9b9;
    *puVar5 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36d,"(toString)","toString");
    if (!bVar2) goto LAB_00d2e9b9;
    *puVar5 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x36e,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00d2e9b9;
    *puVar5 = 0;
  }
  if (toString->directCharLength == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x370,"(!toString->HasOnlyDirectChars())",
                                "!toString->HasOnlyDirectChars()");
    if (!bVar2) {
LAB_00d2e9b9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  CVar3 = Block::PointerLengthFromCharLength(toString->charLength);
  if (CVar3 < 0x40) {
    pJVar6 = GetImmutableOrScriptUnreferencedString(s);
    pTVar7 = Block::Pointers(toString);
    pTVar7 = pTVar7 + CVar3;
    Memory::Recycler::WBSetBit((char *)pTVar7);
    pTVar7->ptr = pJVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar7);
    uVar8 = appendCharLength + toString->stringLength;
    if (0x7ffffffe < uVar8) {
      Throw::OutOfMemory();
    }
    toString->stringLength = uVar8;
    CVar4 = Block::CharLengthFromPointerLength(CVar3 + 1);
    toString->charLength = CVar4;
  }
  return CVar3 < 0x40;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        JavascriptString *const s,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(appendCharLength == s->GetLength());
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!toString->HasOnlyDirectChars());

        const CharCount blockPointerLength = toString->LastBlockPointerLength();
        if(blockPointerLength < toString->LastBlockPointerCapacity())
        {
            toString->LastBlockPointers()[blockPointerLength] = GetImmutableOrScriptUnreferencedString(s);
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockPointerLength(blockPointerLength + 1);
            return true;
        }
        return false;
    }